

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O3

int CVodeGetRootInfo(void *cvode_mem,int *rootsfound)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  
  if (cvode_mem == (void *)0x0) {
    iVar4 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,0x5e3,"CVodeGetRootInfo",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_io.c"
                   ,"cvode_mem = NULL illegal.");
  }
  else {
    iVar1 = *(int *)((long)cvode_mem + 0x568);
    if ((long)iVar1 < 1) {
      iVar4 = 0;
    }
    else {
      lVar2 = *(long *)((long)cvode_mem + 0x570);
      iVar4 = 0;
      lVar3 = 0;
      do {
        rootsfound[lVar3] = *(int *)(lVar2 + lVar3 * 4);
        lVar3 = lVar3 + 1;
      } while (iVar1 != lVar3);
    }
  }
  return iVar4;
}

Assistant:

int CVodeGetRootInfo(void* cvode_mem, int* rootsfound)
{
  CVodeMem cv_mem;
  int i, nrt;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  nrt = cv_mem->cv_nrtfn;

  for (i = 0; i < nrt; i++) { rootsfound[i] = cv_mem->cv_iroots[i]; }

  return (CV_SUCCESS);
}